

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O0

int Cec_ManCountNonConstOutputs(Gia_Man_t *pAig)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pAig_local;
  
  local_28 = 0;
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    pAig_local._4_4_ = -1;
  }
  else {
    local_24 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(pAig);
      bVar2 = false;
      if (local_24 < iVar1) {
        _Counter = Gia_ManCo(pAig,local_24);
        bVar2 = _Counter != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Gia_ObjFaninId0p(pAig,_Counter);
      iVar1 = Gia_ObjIsConst(pAig,iVar1);
      if (iVar1 == 0) {
        local_28 = local_28 + 1;
      }
      local_24 = local_24 + 1;
    }
    pAig_local._4_4_ = local_28;
  }
  return pAig_local._4_4_;
}

Assistant:

int Cec_ManCountNonConstOutputs( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( pAig->pReprs == NULL )
        return -1;
    Gia_ManForEachPo( pAig, pObj, i )
        if ( !Gia_ObjIsConst( pAig, Gia_ObjFaninId0p(pAig, pObj) ) )
            Counter++;
    return Counter;
}